

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

int Cba_ManMemory(Cba_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  Cba_Ntk_t *p_00;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int nMem;
  int i;
  Cba_Ntk_t *pNtk;
  Cba_Man_t *p_local;
  
  if (p->pName == (char *)0x0) {
    local_24 = 0;
  }
  else {
    sVar4 = strlen(p->pName);
    local_24 = (int)sVar4;
  }
  if (p->pSpec == (char *)0x0) {
    local_28 = 0;
  }
  else {
    sVar4 = strlen(p->pSpec);
    local_28 = (int)sVar4;
  }
  iVar1 = Abc_NamMemUsed(p->pStrs);
  iVar2 = Abc_NamMemUsed(p->pFuns);
  iVar3 = Abc_NamMemUsed(p->pMods);
  dVar5 = Vec_IntMemory(&p->vNameMap);
  dVar6 = Vec_IntMemory(&p->vUsed);
  dVar7 = Vec_StrMemory(&p->vOut);
  dVar8 = Vec_StrMemory(&p->vOut2);
  dVar9 = Vec_PtrMemory(&p->vNtks);
  local_20 = (int)dVar9 +
             (int)dVar8 +
             (int)dVar7 +
             (int)dVar6 + (int)dVar5 + iVar3 + iVar2 + iVar1 + local_28 + local_24 + 0x658;
  for (local_1c = 1; iVar1 = Cba_ManNtkNum(p), local_1c <= iVar1; local_1c = local_1c + 1) {
    p_00 = Cba_ManNtk(p,local_1c);
    iVar1 = Cba_NtkMemory(p_00);
    local_20 = iVar1 + local_20;
  }
  return local_20;
}

Assistant:

static inline int Cba_ManMemory( Cba_Man_t * p )
{
    Cba_Ntk_t * pNtk; int i;
    int nMem = sizeof(Cba_Man_t);
    nMem += p->pName ? (int)strlen(p->pName) : 0;
    nMem += p->pSpec ? (int)strlen(p->pSpec) : 0;
    nMem += Abc_NamMemUsed(p->pStrs);
    nMem += Abc_NamMemUsed(p->pFuns);
    nMem += Abc_NamMemUsed(p->pMods);
    nMem += (int)Vec_IntMemory(&p->vNameMap );   
    nMem += (int)Vec_IntMemory(&p->vUsed );  
    nMem += (int)Vec_StrMemory(&p->vOut );   
    nMem += (int)Vec_StrMemory(&p->vOut2 );  
    nMem += (int)Vec_PtrMemory(&p->vNtks);
    Cba_ManForEachNtk( p, pNtk, i )
        nMem += Cba_NtkMemory( pNtk );
    return nMem;
}